

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

Real __thiscall PeleLM::getMFsum(PeleLM *this,MultiFab *a_MF,int comp)

{
  EBCellFlagFab *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FabType FVar6;
  long lVar7;
  FabArray<amrex::EBCellFlagFab> *pFVar8;
  FabArray<amrex::FArrayBox> *pFVar9;
  long lVar10;
  int iVar11;
  pointer *ppbVar12;
  uint uVar13;
  void *__s;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  MFIter mfi;
  Array4<const_double> vfrac;
  MultiFab MFTemp;
  Real local_360;
  Box local_334;
  long local_318;
  long local_310;
  long local_308;
  int local_2fc;
  Array4<double> local_2f8;
  Array4<const_double> local_2b8;
  FabArray<amrex::FArrayBox> *local_278;
  PeleLM *local_270;
  long local_268;
  long local_260;
  undefined1 local_258 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  int local_230;
  Vector<int,_std::allocator<int>_> *local_218;
  Array4<const_double> local_1f0;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_258._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_258._8_8_ = (FabArrayBase *)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.p = (double *)&PTR__FabFactory_008378d0;
  local_2fc = comp;
  local_270 = this;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,
             &(a_MF->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(a_MF->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
             (MFInfo *)local_258,(FabFactory<amrex::FArrayBox> *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  amrex::MFIter::MFIter((MFIter *)local_258,(FabArrayBase *)a_MF,true);
  pFVar9 = &a_MF->super_FabArray<amrex::FArrayBox>;
  if ((int)local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_230) {
    do {
      local_278 = pFVar9;
      pFVar9 = local_278;
      amrex::MFIter::tilebox(&local_334,(MFIter *)local_258);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2b8,pFVar9,(MFIter *)local_258,local_2fc);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2f8,&local_1b0,(MFIter *)local_258);
      lVar7 = __dynamic_cast((local_270->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (lVar7 == 0) {
        __cxa_bad_cast();
      }
      pFVar8 = amrex::EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar7 + 0xd8));
      ppbVar12 = &local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_218 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar12 = (pointer *)
                   ((local_218->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start +
                   (int)local_248.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      this_00 = (pFVar8->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar12];
      FVar6 = amrex::EBCellFlagFab::getType(this_00,&local_334);
      iVar5 = local_334.bigend.vect[2];
      iVar4 = local_334.bigend.vect[1];
      iVar3 = local_334.bigend.vect[0];
      iVar2 = local_334.smallend.vect[1];
      iVar11 = local_334.smallend.vect[0];
      if (FVar6 == covered) {
        if (local_334.smallend.vect[2] <= local_334.bigend.vect[2]) {
          local_308 = CONCAT44(local_2f8.kstride._4_4_,(int)local_2f8.kstride);
          lVar16 = (long)local_334.smallend.vect[0];
          uVar13 = local_334.bigend.vect[0] - local_334.smallend.vect[0];
          lVar7 = CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 8;
          local_318 = ((long)local_334.smallend.vect[1] - (long)local_2f8.begin.y) * lVar7 +
                      (long)local_2f8.begin.x * -8 + CONCAT44(local_2f8.p._4_4_,(int)local_2f8.p);
          local_310 = CONCAT44(local_310._4_4_,
                               (local_334.bigend.vect[1] - local_334.smallend.vect[1]) + 1);
          iVar20 = local_334.smallend.vect[2] - local_2f8.begin.z;
          iVar1 = local_334.smallend.vect[2];
          do {
            if (iVar2 <= iVar4) {
              __s = (void *)(local_318 + (iVar20 * local_308 + lVar16) * 8);
              iVar14 = (int)local_310;
              do {
                if (iVar11 <= iVar3) {
                  memset(__s,0,(ulong)uVar13 * 8 + 8);
                }
                __s = (void *)((long)__s + lVar7);
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            iVar20 = iVar20 + 1;
            bVar22 = iVar1 != iVar5;
            iVar1 = iVar1 + 1;
          } while (bVar22);
        }
      }
      else {
        FVar6 = amrex::EBCellFlagFab::getType(this_00,&local_334);
        if (FVar6 == regular) {
          if (local_334.smallend.vect[2] <= local_334.bigend.vect[2]) {
            lVar16 = (long)local_334.smallend.vect[1];
            lVar7 = CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 8;
            iVar11 = local_334.smallend.vect[2];
            do {
              if (local_334.smallend.vect[1] <= local_334.bigend.vect[1]) {
                lVar15 = ((long)iVar11 - (long)local_2f8.begin.z) *
                         CONCAT44(local_2f8.kstride._4_4_,(int)local_2f8.kstride) * 8 +
                         (lVar16 - local_2f8.begin.y) * lVar7 + (long)local_334.smallend.vect[0] * 8
                         + (long)local_2f8.begin.x * -8 +
                         CONCAT44(local_2f8.p._4_4_,(int)local_2f8.p);
                lVar21 = (long)local_2b8.p +
                         ((long)iVar11 - (long)local_2b8.begin.z) * local_2b8.kstride * 8 +
                         (lVar16 - local_2b8.begin.y) * local_2b8.jstride * 8 +
                         (long)local_334.smallend.vect[0] * 8 + (long)local_2b8.begin.x * -8;
                lVar17 = lVar16;
                do {
                  if (local_334.smallend.vect[0] <= local_334.bigend.vect[0]) {
                    lVar18 = 0;
                    do {
                      *(undefined8 *)(lVar15 + lVar18 * 8) = *(undefined8 *)(lVar21 + lVar18 * 8);
                      lVar18 = lVar18 + 1;
                    } while ((local_334.bigend.vect[0] - local_334.smallend.vect[0]) + 1 !=
                             (int)lVar18);
                  }
                  lVar17 = lVar17 + 1;
                  lVar15 = lVar15 + lVar7;
                  lVar21 = lVar21 + local_2b8.jstride * 8;
                } while (local_334.bigend.vect[1] + 1 != (int)lVar17);
              }
              bVar22 = iVar11 != local_334.bigend.vect[2];
              iVar11 = iVar11 + 1;
            } while (bVar22);
          }
        }
        else {
          pFVar9 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar7 + 0xd8))->
                    super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,pFVar9,(MFIter *)local_258);
          if (local_334.smallend.vect[2] <= local_334.bigend.vect[2]) {
            lVar16 = (long)local_334.smallend.vect[1];
            lVar21 = (long)local_334.smallend.vect[0];
            lVar7 = CONCAT44(local_2f8.jstride._4_4_,(int)local_2f8.jstride) * 8;
            lVar17 = CONCAT44(local_1f0.jstride._4_4_,(undefined4)local_1f0.jstride) * 8;
            local_310 = (lVar16 - local_2f8.begin.y) * lVar7 + lVar21 * 8 +
                        (long)local_2f8.begin.x * -8 + CONCAT44(local_2f8.p._4_4_,(int)local_2f8.p);
            local_318 = (lVar16 - local_1f0.begin.y) * lVar17 + lVar21 * 8 +
                        (long)local_1f0.begin.x * -8 + (long)local_1f0.p;
            local_308 = local_1f0.kstride * 8;
            local_260 = (lVar16 - local_2b8.begin.y) * local_2b8.jstride * 8 + lVar21 * 8 +
                        (long)local_2b8.begin.x * -8 + (long)local_2b8.p;
            local_268 = -(long)local_2b8.begin.z;
            iVar11 = local_334.smallend.vect[2];
            do {
              if (local_334.smallend.vect[1] <= local_334.bigend.vect[1]) {
                lVar21 = (long)iVar11;
                lVar18 = (lVar21 - local_2f8.begin.z) *
                         CONCAT44(local_2f8.kstride._4_4_,(int)local_2f8.kstride) * 8 + local_310;
                lVar15 = (lVar21 - local_1f0.begin.z) * local_308 + local_318;
                lVar19 = (lVar21 + local_268) * local_2b8.kstride * 8 + local_260;
                lVar21 = lVar16;
                do {
                  if (local_334.smallend.vect[0] <= local_334.bigend.vect[0]) {
                    lVar10 = 0;
                    do {
                      *(double *)(lVar18 + lVar10 * 8) =
                           *(double *)(lVar19 + lVar10 * 8) * *(double *)(lVar15 + lVar10 * 8);
                      lVar10 = lVar10 + 1;
                    } while ((local_334.bigend.vect[0] - local_334.smallend.vect[0]) + 1 !=
                             (int)lVar10);
                  }
                  lVar21 = lVar21 + 1;
                  lVar18 = lVar18 + lVar7;
                  lVar15 = lVar15 + lVar17;
                  lVar19 = lVar19 + local_2b8.jstride * 8;
                } while (local_334.bigend.vect[1] + 1 != (int)lVar21);
              }
              bVar22 = iVar11 != local_334.bigend.vect[2];
              iVar11 = iVar11 + 1;
            } while (bVar22);
          }
        }
      }
      amrex::MFIter::operator++((MFIter *)local_258);
      pFVar9 = local_278;
    } while ((int)local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_230);
  }
  amrex::MFIter::~MFIter((MFIter *)local_258);
  local_1f0.p = (double *)0x0;
  local_1f0.jstride._0_4_ = 0;
  amrex::MFIter::MFIter((MFIter *)local_258,&local_1b0.super_FabArrayBase,true);
  local_360 = 0.0;
  if ((int)local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_230) {
    local_360 = 0.0;
    do {
      amrex::MFIter::growntilebox((Box *)&local_2f8,(MFIter *)local_258,(IntVect *)&local_1f0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2b8,&local_1b0,(MFIter *)local_258);
      lVar7 = (long)(int)local_2f8.jstride;
      dVar23 = 0.0;
      if ((int)local_2f8.jstride <= local_2f8.kstride._4_4_) {
        lVar16 = ((long)local_2f8.p._4_4_ - (long)local_2b8.begin.y) * local_2b8.jstride * 8 +
                 (lVar7 - local_2b8.begin.z) * local_2b8.kstride * 8 + (long)(int)local_2f8.p * 8 +
                 (long)local_2b8.begin.x * -8 + (long)local_2b8.p;
        do {
          lVar17 = lVar16;
          lVar21 = (long)local_2f8.p._4_4_;
          if (local_2f8.p._4_4_ <= (int)local_2f8.kstride) {
            do {
              if ((int)local_2f8.p <= local_2f8.jstride._4_4_) {
                lVar15 = 0;
                do {
                  dVar23 = dVar23 + *(double *)(lVar17 + lVar15 * 8);
                  lVar15 = lVar15 + 1;
                } while ((local_2f8.jstride._4_4_ - (int)local_2f8.p) + 1 != (int)lVar15);
              }
              lVar21 = lVar21 + 1;
              lVar17 = lVar17 + local_2b8.jstride * 8;
            } while ((int)local_2f8.kstride + 1 != (int)lVar21);
          }
          lVar7 = lVar7 + 1;
          lVar16 = lVar16 + local_2b8.kstride * 8;
        } while (local_2f8.kstride._4_4_ + 1 != (int)lVar7);
      }
      local_360 = local_360 + dVar23;
      amrex::MFIter::operator++((MFIter *)local_258);
    } while ((int)local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_230);
  }
  amrex::MFIter::~MFIter((MFIter *)local_258);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return local_360;
}

Assistant:

Real
PeleLM::getMFsum(MultiFab& a_MF,
                 int comp)
{
   AMREX_ASSERT(a_MF.nComp() >= comp);

#ifdef AMREX_USE_EB
   //
   // To get vfrac weighted sum, I need to build MF*vfrac and then do the sum
   MultiFab MFTemp(a_MF.boxArray(),a_MF.DistributionMap(),1,0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(a_MF,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& dat = a_MF.const_array(mfi,comp);
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) == FabType::regular ) {     // Regular boxes
         amrex::ParallelFor(bx, [dat,temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k);
         });
      } else {                                                   // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [dat,temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k) * vfrac(i,j,k);
         });
      }
   }

   Real weighted_sum = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(weighted_sum);

   return weighted_sum;
#else
   Real sum = a_MF.sum(comp,false);
   return sum;
#endif
}